

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

nodes_slot __thiscall
libtorrent::anon_unknown_62::write_nodes
          (anon_unknown_62 *this,stack_allocator *alloc,
          vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
          *nodes)

{
  pointer ppVar1;
  void *this_00;
  allocation_slot idx;
  allocation_slot idx_00;
  pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_> *n;
  pointer ppVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  int iVar4;
  char **out;
  vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
  *__range2;
  int iVar5;
  endpoint *endp;
  basic_endpoint<boost::asio::ip::udp> *e;
  bool bVar6;
  nodes_slot nVar7;
  char *v4_ptr;
  char *v6_ptr;
  char *local_70;
  int local_68;
  int local_64;
  char *local_60;
  _Tuple_impl<2UL,_int,_libtorrent::aux::allocation_slot> local_58;
  string local_50;
  
  iVar5 = 0;
  iVar4 = 0;
  for (ppVar2 = (nodes->
                super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar2 != (nodes->
                super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; ppVar2 = ppVar2 + 1) {
    bVar6 = (ppVar2->second).impl_.data_.base.sa_family == 2;
    iVar5 = iVar5 + (uint)!bVar6;
    iVar4 = iVar4 + (uint)bVar6;
  }
  local_58 = (_Tuple_impl<2UL,_int,_libtorrent::aux::allocation_slot>)this;
  idx = aux::stack_allocator::allocate(alloc,iVar4 * 0x1a);
  idx_00 = aux::stack_allocator::allocate(alloc,iVar5 * 0x26);
  local_64 = idx.m_idx;
  local_70 = aux::stack_allocator::ptr(alloc,idx);
  local_68 = idx_00.m_idx;
  local_60 = aux::stack_allocator::ptr(alloc,idx_00);
  ppVar2 = (nodes->
           super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (nodes->
           super__Vector_base<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = extraout_RDX;
  while (e = (basic_endpoint<boost::asio::ip::udp> *)(&ppVar2->first + 1),
        this_00 = (void *)((long)(e + -1) + 8), (pointer)this_00 != ppVar1) {
    if ((e->impl_).data_.base.sa_family == 2) {
      digest32<160l>::to_string_abi_cxx11_(&local_50,this_00);
      memcpy(local_70,local_50._M_dataplus._M_p,local_50._M_string_length);
      local_70 = local_70 + local_50._M_string_length;
      std::__cxx11::string::~string((string *)&local_50);
      out = &local_70;
    }
    else {
      digest32<160l>::to_string_abi_cxx11_(&local_50,this_00);
      memcpy(local_60,local_50._M_dataplus._M_p,local_50._M_string_length);
      local_60 = local_60 + local_50._M_string_length;
      std::__cxx11::string::~string((string *)&local_50);
      out = &local_60;
    }
    detail::write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char*&>(e,out);
    ppVar2 = (pointer)(e + 1);
    uVar3 = extraout_RDX_00;
  }
  *(int *)local_58 = local_68;
  *(int *)((long)local_58 + 4) = iVar5;
  *(int *)((long)local_58 + 8) = local_64;
  *(int *)((long)local_58 + 0xc) = iVar4;
  nVar7.
  super__Tuple_impl<0UL,_int,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>
  .super__Tuple_impl<1UL,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>.
  super__Head_base<1UL,_libtorrent::aux::allocation_slot,_false>._M_head_impl.m_idx =
       (allocation_slot)(allocation_slot)(int)uVar3;
  nVar7.
  super__Tuple_impl<0UL,_int,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>
  .super__Head_base<0UL,_int,_false>._M_head_impl = (int)((ulong)uVar3 >> 0x20);
  nVar7.
  super__Tuple_impl<0UL,_int,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>
  .super__Tuple_impl<1UL,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>.
  super__Tuple_impl<2UL,_int,_libtorrent::aux::allocation_slot> = local_58;
  return (nodes_slot)
         nVar7.
         super__Tuple_impl<0UL,_int,_libtorrent::aux::allocation_slot,_int,_libtorrent::aux::allocation_slot>
  ;
}

Assistant:

nodes_slot write_nodes(aux::stack_allocator& alloc
		, std::vector<std::pair<sha1_hash, udp::endpoint>> const& nodes)
	{
		int v4_num_nodes = 0;
		int v6_num_nodes = 0;

		for (auto const& n : nodes)
		{
			if (is_v4(n.second))
				v4_num_nodes++;
			else
				v6_num_nodes++;
		}

		aux::allocation_slot const v4_nodes_idx = alloc.allocate(v4_num_nodes * (20 + 6));
		aux::allocation_slot const v6_nodes_idx = alloc.allocate(v6_num_nodes * (20 + 18));

		char* v4_ptr = alloc.ptr(v4_nodes_idx);
		char* v6_ptr = alloc.ptr(v6_nodes_idx);
		for (auto const& n : nodes)
		{
			udp::endpoint const& endp = n.second;
			if (is_v4(endp))
			{
				detail::write_string(n.first.to_string(), v4_ptr);
				detail::write_endpoint(endp, v4_ptr);
			}
			else
			{
				detail::write_string(n.first.to_string(), v6_ptr);
				detail::write_endpoint(endp, v6_ptr);
			}
		}

		return nodes_slot{v4_num_nodes, v4_nodes_idx, v6_num_nodes, v6_nodes_idx};
	}